

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O2

string * __thiscall
Settings::fileToFix_abi_cxx11_(string *__return_storage_ptr__,Settings *this,int n)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)((long)(int)this * 0x20 + files_abi_cxx11_._0_8_));
  return __return_storage_ptr__;
}

Assistant:

std::string fileToFix(const int n){ return files[n]; }